

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hello_world.cpp
# Opt level: O0

void __thiscall hello::gform(hello *this)

{
  bool bVar1;
  pointer ppVar2;
  ostream *poVar3;
  const_iterator p;
  string message;
  string name;
  multimap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *in_stack_fffffffffffffe88;
  _Self local_c8;
  allocator local_b9;
  string local_b8 [32];
  _Base_ptr local_98;
  _Self local_90;
  allocator local_81;
  string local_80 [48];
  _Self local_50;
  string local_48 [32];
  string local_28 [40];
  
  std::__cxx11::string::string(local_28);
  std::__cxx11::string::string(local_48);
  cppcms::application::request();
  cppcms::http::request::get_abi_cxx11_();
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_80,"name",&local_81);
  local_50._M_node =
       (_Base_ptr)
       std::
       multimap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
       ::find(in_stack_fffffffffffffe88,(key_type *)0x135eef);
  std::__cxx11::string::~string(local_80);
  std::allocator<char>::~allocator((allocator<char> *)&local_81);
  cppcms::application::request();
  cppcms::http::request::get_abi_cxx11_();
  local_90._M_node =
       (_Base_ptr)
       std::
       multimap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
       ::end(in_stack_fffffffffffffe88);
  bVar1 = std::operator!=(&local_50,&local_90);
  if (bVar1) {
    ppVar2 = std::
             _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator->((_Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)0x135f8b);
    std::__cxx11::string::operator=(local_28,(string *)&ppVar2->second);
  }
  cppcms::application::request();
  cppcms::http::request::get_abi_cxx11_();
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_b8,"message",&local_b9);
  local_98 = (_Base_ptr)
             std::
             multimap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::find(in_stack_fffffffffffffe88,(key_type *)0x136069);
  local_50._M_node = local_98;
  cppcms::application::request();
  cppcms::http::request::get_abi_cxx11_();
  local_c8._M_node =
       (_Base_ptr)
       std::
       multimap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
       ::end(in_stack_fffffffffffffe88);
  bVar1 = std::operator!=(&local_50,&local_c8);
  std::__cxx11::string::~string(local_b8);
  std::allocator<char>::~allocator((allocator<char> *)&local_b9);
  if (bVar1) {
    ppVar2 = std::
             _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator->((_Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)0x13610e);
    std::__cxx11::string::operator=(local_48,(string *)&ppVar2->second);
  }
  cppcms::application::response();
  poVar3 = (ostream *)cppcms::http::response::out();
  poVar3 = std::operator<<(poVar3,
                           "<html><body><form method=\"get\" action=\"/hello/get\" ><input name=\"name\" type=\"text\" /><br/><textarea name=\"message\"></textarea><br/><input type=\"Submit\" value=\"Submit\" /></form>"
                          );
  poVar3 = std::operator<<(poVar3,"Name:");
  poVar3 = std::operator<<(poVar3,local_28);
  poVar3 = std::operator<<(poVar3,"<br/>\n");
  poVar3 = std::operator<<(poVar3,"Text:");
  poVar3 = std::operator<<(poVar3,local_48);
  std::operator<<(poVar3,"</body></html>");
  std::__cxx11::string::~string(local_48);
  std::__cxx11::string::~string(local_28);
  return;
}

Assistant:

void gform()
	{
		std::string name;
		std::string message;
		cppcms::http::request::form_type::const_iterator p=request().get().find("name");
		if(p!=request().get().end())
			name=p->second;
		if((p=request().get().find("message"))!=request().get().end())
			message=p->second;
		
		response().out() <<
			"<html><body>"
			"<form method=\"get\" action=\"/hello/get\" >"
			"<input name=\"name\" type=\"text\" /><br/>"
			"<textarea name=\"message\"></textarea><br/>"
			"<input type=\"Submit\" value=\"Submit\" />"
			"</form>"
			<<"Name:"<<name<<"<br/>\n"
			<<"Text:"<<message<<
			"</body></html>";

	}